

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  undefined4 extraout_var_02;
  long lVar5;
  cmCustomCommandLine singleLine;
  string configFile;
  GlobalTargetInfo gti;
  allocator<char> local_139;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_f8;
  cmMakefile *local_f0;
  string local_e8;
  undefined1 local_c8 [88];
  pointer pbStack_70;
  pointer local_68;
  pointer pbStack_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  local_f0 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_f8 = targets;
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_f0);
  std::__cxx11::string::string((string *)&local_e8,(string *)psVar3);
  std::__cxx11::string::append((char *)&local_e8);
  bVar1 = cmsys::SystemTools::FileExists(&local_e8);
  if (bVar1) {
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) {
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
        this_00 = local_f0;
        pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
        local_c8._0_8_ = local_c8 + 0x10;
        local_c8._8_8_ = 0;
        local_c8[0x10] = '\0';
        local_c8._32_8_ = local_c8 + 0x30;
        local_c8._40_8_ = 0;
        local_c8[0x30] = '\0';
        local_58._M_p = (pointer)&local_48;
        local_c8._64_8_ = (pointer)0x0;
        local_c8._72_8_ = (pointer)0x0;
        local_c8._80_8_ = (pointer)0x0;
        pbStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        pbStack_60 = (pointer)0x0;
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        local_38 = false;
        (*this->_vptr_cmGlobalGenerator[0x1d])(this);
        std::__cxx11::string::assign(local_c8);
        std::__cxx11::string::assign(local_c8 + 0x20);
        local_38 = true;
        cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        std::__cxx11::string::_M_assign((string *)&local_58);
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar3 = cmSystemTools::GetCPackCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_118,psVar3);
        if (((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) && (*pcVar4 != '.')) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"-C",&local_139);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118
                     ,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar4,&local_139)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118
                     ,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"--config",&local_139);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                   &local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"./CPackConfig.cmake",&local_139);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                   &local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_c8 + 0x40),(cmCustomCommandLine *)&local_118);
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_139);
          pcVar4 = cmMakefile::GetDefinition(this_00,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          if ((pcVar4 == (char *)0x0) || (bVar1 = cmSystemTools::IsOff(pcVar4), bVar1)) {
            iVar2 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
            local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pbStack_70,(char **)&local_138);
          }
        }
        else {
          iVar2 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
          local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pbStack_70,(char **)&local_138);
        }
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_f8,(GlobalTargetInfo *)local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_c8);
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c8,
                 *(char **)((long)&AddGlobalTarget_Package(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                   ::reservedTargets + lVar5),(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"when CPack packaging is enabled",&local_139);
      bVar1 = CheckCMP0037(this,(string *)local_c8,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)local_c8);
      lVar5 = lVar5 + 8;
    } while (bVar1);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackConfig.cmake";
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package", "PACKAGE" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CPack packaging is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  singleLine.push_back("./CPackConfig.cmake");
  gti.CommandLines.push_back(std::move(singleLine));
  if (this->GetPreinstallTargetName()) {
    gti.Depends.emplace_back(this->GetPreinstallTargetName());
  } else {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (!noPackageAll || cmSystemTools::IsOff(noPackageAll)) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  targets.push_back(std::move(gti));
}